

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix.c
# Opt level: O0

int enet_socket_set_option(ENetSocket socket,ENetSocketOption option,int value)

{
  int iVar1;
  long local_38;
  timeval timeVal_1;
  timeval timeVal;
  int result;
  int value_local;
  ENetSocketOption option_local;
  ENetSocket socket_local;
  
  timeVal.tv_usec._0_4_ = -1;
  if (option - ENET_SOCKOPT_NONBLOCK < 9 || option == ENET_SOCKOPT_KEEPALIVE) {
    timeVal.tv_usec._4_4_ = value;
    switch((long)&switchD_001a1efe::switchdataD_001ae960 +
           (long)(int)(&switchD_001a1efe::switchdataD_001ae960)[option - ENET_SOCKOPT_NONBLOCK]) {
    case 0x1a1f00:
      timeVal.tv_usec._0_4_ = ioctl(socket,0x5421,(undefined1 *)((long)&timeVal.tv_usec + 4));
      break;
    case 0x1a1f1b:
      timeVal.tv_usec._0_4_ = setsockopt(socket,1,6,(void *)((long)&timeVal.tv_usec + 4),4);
      break;
    case 0x1a1f3f:
      timeVal.tv_usec._0_4_ = setsockopt(socket,1,2,(void *)((long)&timeVal.tv_usec + 4),4);
      break;
    case 0x1a1f63:
      timeVal.tv_usec._0_4_ = setsockopt(socket,1,8,(void *)((long)&timeVal.tv_usec + 4),4);
      break;
    case 0x1a1f87:
      timeVal.tv_usec._0_4_ = setsockopt(socket,1,7,(void *)((long)&timeVal.tv_usec + 4),4);
      break;
    case 0x1a1fab:
      timeVal_1.tv_usec = (__suseconds_t)(value / 1000);
      timeVal.tv_sec = (__time_t)((value % 1000) * 1000);
      timeVal.tv_usec._0_4_ = setsockopt(socket,1,0x14,&timeVal_1.tv_usec,0x10);
      break;
    case 0x1a1ff7:
      local_38 = (long)(value / 1000);
      timeVal_1.tv_sec = (__time_t)((value % 1000) * 1000);
      timeVal.tv_usec._0_4_ = setsockopt(socket,1,0x15,&local_38,0x10);
      break;
    case 0x1a2040:
      timeVal.tv_usec._0_4_ = setsockopt(socket,6,1,(void *)((long)&timeVal.tv_usec + 4),4);
      break;
    case 0x1a2061:
      timeVal.tv_usec._0_4_ = setsockopt(socket,1,9,(void *)((long)&timeVal.tv_usec + 4),4);
      break;
    case 0x1a2082:
      goto switchD_001a1efe_caseD_1a2082;
    }
  }
  else {
switchD_001a1efe_caseD_1a2082:
  }
  iVar1 = 0;
  if ((int)timeVal.tv_usec == -1) {
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int
enet_socket_set_option (ENetSocket socket, ENetSocketOption option, int value)
{
    int result = -1;
    switch (option)
    {
        case ENET_SOCKOPT_NONBLOCK:
#ifdef HAS_FCNTL
            result = fcntl (socket, F_SETFL, (value ? O_NONBLOCK : 0) | (fcntl (socket, F_GETFL) & ~O_NONBLOCK));
#else
            result = ioctl (socket, FIONBIO, & value);
#endif
            break;

        case ENET_SOCKOPT_BROADCAST:
            result = setsockopt (socket, SOL_SOCKET, SO_BROADCAST, (char *) & value, sizeof (int));
            break;

        case ENET_SOCKOPT_REUSEADDR:
            result = setsockopt (socket, SOL_SOCKET, SO_REUSEADDR, (char *) & value, sizeof (int));
            break;

        case ENET_SOCKOPT_RCVBUF:
            result = setsockopt (socket, SOL_SOCKET, SO_RCVBUF, (char *) & value, sizeof (int));
            break;

        case ENET_SOCKOPT_SNDBUF:
            result = setsockopt (socket, SOL_SOCKET, SO_SNDBUF, (char *) & value, sizeof (int));
            break;

        case ENET_SOCKOPT_RCVTIMEO:
        {
            struct timeval timeVal;
            timeVal.tv_sec = value / 1000;
            timeVal.tv_usec = (value % 1000) * 1000;
            result = setsockopt (socket, SOL_SOCKET, SO_RCVTIMEO, (char *) & timeVal, sizeof (struct timeval));
            break;
        }

        case ENET_SOCKOPT_SNDTIMEO:
        {
            struct timeval timeVal;
            timeVal.tv_sec = value / 1000;
            timeVal.tv_usec = (value % 1000) * 1000;
            result = setsockopt (socket, SOL_SOCKET, SO_SNDTIMEO, (char *) & timeVal, sizeof (struct timeval));
            break;
        }

        case ENET_SOCKOPT_NODELAY:
            result = setsockopt (socket, IPPROTO_TCP, TCP_NODELAY, (char *) & value, sizeof (int));
            break;
        case ENET_SOCKOPT_KEEPALIVE:
            result = setsockopt (socket, SOL_SOCKET, SO_KEEPALIVE, (char *) & value, sizeof (int));
                  break;

        default:
            break;
    }
    return result == -1 ? -1 : 0;
}